

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

unsigned_long hash(XML_Parser parser,KEY s)

{
  long lVar1;
  size_t sVar2;
  uint64_t uVar3;
  size_t len;
  XML_Parser pXVar4;
  siphash state;
  siphash local_40;
  
  do {
    pXVar4 = parser;
    parser = pXVar4->m_parentParser;
  } while (parser != (XML_Parser)0x0);
  local_40.v3 = pXVar4->m_hash_secret_salt;
  local_40.p = local_40.buf;
  local_40.v0 = 0x736f6d6570736575;
  local_40.v1 = local_40.v3 ^ 0x646f72616e646f6d;
  local_40.v2 = 0x6c7967656e657261;
  local_40.v3 = local_40.v3 ^ 0x7465646279746573;
  local_40.c = 0;
  if (*s == '\0') {
    len = 0;
  }
  else {
    sVar2 = 0;
    do {
      len = sVar2 + 1;
      lVar1 = sVar2 + 1;
      sVar2 = len;
    } while (s[lVar1] != '\0');
  }
  sip24_update(&local_40,s,len);
  uVar3 = sip24_final(&local_40);
  return uVar3;
}

Assistant:

static unsigned long FASTCALL
hash(XML_Parser parser, KEY s)
{
  struct siphash state;
  struct sipkey key;
  (void)sip_tobin;
  (void)sip24_valid;
  copy_salt_to_sipkey(parser, &key);
  sip24_init(&state, &key);
  sip24_update(&state, s, keylen(s) * sizeof(XML_Char));
  return (unsigned long)sip24_final(&state);
}